

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool roaring_previous_uint32_iterator(roaring_uint32_iterator_t *it)

{
  long lVar1;
  uint8_t uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  _Bool _Var6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  
  iVar3 = it->container_index;
  if (iVar3 < 0) {
LAB_00113f0e:
    it->has_value = false;
    return false;
  }
  iVar4 = (it->parent->high_low_container).size;
  if (iVar4 <= iVar3) {
    it->container_index = iVar4 + -1;
    goto LAB_00113f1b;
  }
  uVar2 = it->typecode;
  if (uVar2 == '\x03') {
    if (it->current_value == 0) goto LAB_00113f0e;
    uVar7 = it->current_value - 1;
    it->current_value = uVar7;
    lVar5 = *(long *)((long)it->container + 8);
    iVar4 = it->run_index;
    if (((uint)*(ushort *)(lVar5 + (long)iVar4 * 4) | it->highbits) <= uVar7) goto LAB_00113f3d;
    uVar7 = iVar4 - 1;
    it->run_index = uVar7;
    if (0 < iVar4) {
      uVar7 = (uint)*(ushort *)(lVar5 + 2 + (ulong)uVar7 * 4) +
              (uint)*(ushort *)(lVar5 + (ulong)uVar7 * 4) | it->highbits;
      goto LAB_00113f09;
    }
  }
  else if (uVar2 == '\x02') {
    iVar4 = it->in_container_index;
    uVar7 = iVar4 - 1;
    it->in_container_index = uVar7;
    if (0 < iVar4) {
      uVar7 = (uint)*(ushort *)(*(long *)((long)it->container + 8) + (ulong)uVar7 * 2) |
              it->highbits;
LAB_00113f09:
      it->current_value = uVar7;
LAB_00113f3d:
      it->has_value = true;
      return true;
    }
  }
  else {
    if (uVar2 != '\x01') {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x4164,"_Bool roaring_previous_uint32_iterator(roaring_uint32_iterator_t *)");
    }
    iVar4 = it->in_container_index;
    uVar7 = iVar4 - 1;
    it->in_container_index = uVar7;
    if (0 < iVar4) {
      uVar9 = (ulong)(uVar7 >> 6);
      lVar5 = *(long *)((long)it->container + 8);
      uVar8 = uVar7 & 0xffffffc0;
      uVar10 = (ulong)(*(long *)(lVar5 + uVar9 * 8) << (~(byte)uVar7 & 0x3f)) >>
               (~(byte)uVar7 & 0x3f);
      while (uVar10 == 0) {
        if ((long)uVar9 < 1) goto LAB_00113f16;
        lVar1 = uVar9 * 8;
        uVar9 = uVar9 - 1;
        uVar8 = uVar8 - 0x40;
        uVar10 = *(ulong *)(lVar5 + -8 + lVar1);
      }
      lVar5 = 0x3f;
      if (uVar10 != 0) {
        for (; uVar10 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      uVar7 = ((uint)lVar5 ^ 0x3f) + uVar8 ^ 0x3f;
      it->in_container_index = uVar7;
      it->current_value = uVar7 | it->highbits;
      goto LAB_00113f3d;
    }
  }
LAB_00113f16:
  it->container_index = iVar3 + -1;
LAB_00113f1b:
  _Var6 = loadlastvalue(it);
  it->has_value = _Var6;
  return _Var6;
}

Assistant:

bool roaring_previous_uint32_iterator(roaring_uint32_iterator_t *it) {
    if (it->container_index < 0) {
        return (it->has_value = false);
    }
    if (it->container_index >= it->parent->high_low_container.size) {
        it->container_index = it->parent->high_low_container.size - 1;
        return (it->has_value = loadlastvalue(it));
    }

    switch (it->typecode) {
        case BITSET_CONTAINER_TYPE: {
            if (--it->in_container_index < 0)
                break;

            const bitset_container_t* bitset_container = (const bitset_container_t*)it->container;
            int32_t wordindex = it->in_container_index / 64;
            uint64_t word = bitset_container->words[wordindex] & (UINT64_MAX >> (63 - (it->in_container_index % 64)));

            while (word == 0 && --wordindex >= 0) {
                word = bitset_container->words[wordindex];
            }
            if (word == 0)
                break;

            int num_leading_zeros = __builtin_clzll(word);
            it->in_container_index = (wordindex * 64) + (63 - num_leading_zeros);
            it->current_value = it->highbits | it->in_container_index;
            return (it->has_value = true);
        }
        case ARRAY_CONTAINER_TYPE: {
            if (--it->in_container_index < 0)
                break;

            const array_container_t* array_container = (const array_container_t*)it->container;
            it->current_value = it->highbits | array_container->array[it->in_container_index];
            return (it->has_value = true);
        }
        case RUN_CONTAINER_TYPE: {
            if(it->current_value == 0)
                return (it->has_value = false);

            const run_container_t* run_container = (const run_container_t*)it->container;
            if (--it->current_value >= (it->highbits | run_container->runs[it->run_index].value)) {
                return (it->has_value = true);
            }

            if (--it->run_index < 0)
                break;

            it->current_value = it->highbits | (run_container->runs[it->run_index].value +
                                                run_container->runs[it->run_index].length);
            return (it->has_value = true);
        }
        default:
            // if this ever happens, bug!
            assert(false);
    }  // switch (typecode)

    // moving to previous container
    it->container_index--;
    return (it->has_value = loadlastvalue(it));
}